

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_string.c
# Opt level: O1

int iterConv(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  _mpt_vptr_convertable *p_Var1;
  int iVar2;
  mpt_metatype *pmVar3;
  size_t sVar4;
  iovec *vec;
  
  if ((long)type < 0x73) {
    if (type == 0) {
      if (dest != (void *)0x0) {
        *(uint8_t **)dest = iterConv::fmt;
        return 0;
      }
      return 0x86;
    }
    if (type == 0x43) {
      if (dest != (void *)0x0) {
        p_Var1 = conv[2]._vptr;
        *(_mpt_vptr_convertable **)dest = p_Var1;
        sVar4 = strlen((char *)p_Var1);
        *(size_t *)((long)dest + 8) = sVar4;
        return 0x73;
      }
      return 0x73;
    }
  }
  else {
    if (type == 0x73) {
      if (dest != (void *)0x0) {
        *(_mpt_vptr_convertable **)dest = conv[2]._vptr;
        return 0x73;
      }
      return 0x73;
    }
    if ((type == 0x86) || (type == 0x100)) {
      if (dest == (void *)0x0) {
        return 0x73;
      }
      p_Var1 = conv[2]._vptr;
      if (p_Var1 != (_mpt_vptr_convertable *)0x0) {
        if (*(char *)&p_Var1->convert == '\0') {
          return -2;
        }
        pmVar3 = (mpt_metatype *)conv[1]._vptr;
        if (pmVar3 == (mpt_metatype *)0x0) {
          pmVar3 = mpt_iterator_string((char *)p_Var1,(char *)conv[3]._vptr);
          if (pmVar3 == (mpt_metatype *)0x0) {
            return -2;
          }
          conv[1]._vptr = (_mpt_vptr_convertable *)pmVar3;
        }
        iVar2 = (*(pmVar3->_vptr->convertable).convert)((mpt_convertable *)pmVar3,type,dest);
        return iVar2;
      }
      return -2;
    }
  }
  if (conv[2]._vptr == (_mpt_vptr_convertable *)0x0) {
    return 0;
  }
  iVar2 = mpt_convert_string((char *)conv[2]._vptr,type,dest);
  if (iVar2 < 0) {
    return iVar2;
  }
  return 0x73;
}

Assistant:

static int iterConv(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	struct wrapIter *it = (void *) conv;
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 's', 0 };
		if (dest) {
			*((const uint8_t **) dest) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == MPT_ENUM(TypeIteratorPtr) || type == MPT_ENUM(TypeMetaPtr)) {
		if (dest) {
			MPT_INTERFACE(metatype) *src;
			if (!it->val || !*it->val) {
				return MPT_ERROR(BadValue);
			}
			if (!(src = it->src)) {
				if (!(src = mpt_iterator_string(it->val, it->sep))) {
					return MPT_ERROR(BadValue);
				}
				it->src = src;
			}
			return MPT_metatype_convert(src, type, dest);
		}
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		struct iovec *vec;
		if ((vec = dest)) {
			vec->iov_base = (void *) it->val;
			vec->iov_len = strlen(it->val);
		}
		return 's';
	}
	if (type == 's') {
		if (dest) {
			*((const char **) dest) = it->val;
		}
		return 's';
	}
	if (it->val) {
		int ret = mpt_convert_string(it->val, type, dest);
		if (ret < 0) {
			return ret;
		}
		return 's';
	}
	return 0;
}